

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall
QDockWidgetTitleButton::paintEvent(QDockWidgetTitleButton *this,QPaintEvent *param_1)

{
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QIcon moved;
  QStyleOptionToolButton opt;
  QIconPrivate *local_f0;
  undefined1 *local_e8;
  QDockWidgetTitleButton *pQStack_e0;
  QStyle *local_d8;
  QIcon local_c8;
  QStyleOptionToolButton local_c0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_e0 = (QDockWidgetTitleButton *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_e8);
  pQStack_e0 = this;
  local_d8 = QWidget::style((QWidget *)this);
  QPainter::begin((QPaintDevice *)&local_e8);
  QPainter::setRenderHint((RenderHint)(QPainter *)&local_e8,true);
  memset(&local_c0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&local_c0);
  QStyleOption::initFrom((QStyleOption *)&local_c0,(QWidget *)this);
  local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
  super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
       local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
       super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i.
       _1_1_ | 0x10;
  pQVar3 = QWidget::style((QWidget *)this);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x5d,0,this,0);
  if (iVar2 == 0) {
    bVar1 = QAbstractButton::isDown(&this->super_QAbstractButton);
    if (!bVar1) {
      bVar1 = QAbstractButton::isChecked(&this->super_QAbstractButton);
      if (!bVar1) goto LAB_00405a87;
    }
    local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
         (byte)local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 0x24;
  }
  else {
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 3) == 2) {
      bVar1 = QAbstractButton::isChecked(&this->super_QAbstractButton);
      if (!bVar1) {
        bVar1 = QAbstractButton::isDown(&this->super_QAbstractButton);
        if (!bVar1) {
          local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
          super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i.
          _0_1_ = (byte)local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
                        super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i | 2;
        }
      }
    }
    bVar1 = QAbstractButton::isChecked(&this->super_QAbstractButton);
    if (bVar1) {
      local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_1_
           = (byte)local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
                   super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i | 0x20;
    }
    bVar1 = QAbstractButton::isDown(&this->super_QAbstractButton);
    if (bVar1) {
      local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_1_
           = (byte)local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
                   super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i | 4;
    }
    (**(code **)(*(long *)local_d8 + 0xb0))(local_d8,0xf,&local_c0,&local_e8,pQStack_e0);
  }
LAB_00405a87:
  QAbstractButton::icon((QAbstractButton *)&local_f0);
  local_c8.d = local_c0.icon.d;
  local_c0.icon.d = local_f0;
  local_f0 = (QIconPrivate *)0x0;
  QIcon::~QIcon(&local_c8);
  QIcon::~QIcon((QIcon *)&local_f0);
  local_c0.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  local_c0.super_QStyleOptionComplex.activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  local_c0.features.super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
  super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i =
       (QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>)
       (QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>)0x0;
  local_c0.arrowType = NoArrow;
  local_c0.iconSize = dockButtonIconSize(this);
  (**(code **)(*(long *)local_d8 + 200))(local_d8,4,&local_c0,&local_e8,pQStack_e0);
  QFont::~QFont(&local_c0.font);
  if (&(local_c0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_c0.icon);
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  QPainter::~QPainter((QPainter *)&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetTitleButton::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);

    QStyleOptionToolButton opt;
    opt.initFrom(this);
    opt.state |= QStyle::State_AutoRaise;

    if (style()->styleHint(QStyle::SH_DockWidget_ButtonsHaveFrame, nullptr, this)) {
        if (isEnabled() && underMouse() && !isChecked() && !isDown())
            opt.state |= QStyle::State_Raised;
        if (isChecked())
            opt.state |= QStyle::State_On;
        if (isDown())
            opt.state |= QStyle::State_Sunken;
        p.drawPrimitive(QStyle::PE_PanelButtonTool, opt);
    } else if (isDown() || isChecked()) {
        // no frame, but the icon might have explicit pixmaps for QIcon::On
        opt.state |= QStyle::State_On | QStyle::State_Sunken;
    }

    opt.icon = icon();
    opt.subControls = { };
    opt.activeSubControls = { };
    opt.features = QStyleOptionToolButton::None;
    opt.arrowType = Qt::NoArrow;
    opt.iconSize = dockButtonIconSize();
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}